

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zesStandbySetMode(zes_standby_handle_t hStandby,zes_standby_promo_mode_t mode)

{
  zes_pfnStandbySetMode_t pfnSetMode;
  dditable_t *dditable;
  ze_result_t result;
  zes_standby_promo_mode_t mode_local;
  zes_standby_handle_t hStandby_local;
  
  if (*(code **)(*(long *)(hStandby + 8) + 0xb88) == (code *)0x0) {
    hStandby_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hStandby_local._4_4_ =
         (**(code **)(*(long *)(hStandby + 8) + 0xb88))(*(undefined8 *)hStandby,mode);
  }
  return hStandby_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesStandbySetMode(
        zes_standby_handle_t hStandby,                  ///< [in] Handle for the component.
        zes_standby_promo_mode_t mode                   ///< [in] New standby mode.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_standby_object_t*>( hStandby )->dditable;
        auto pfnSetMode = dditable->zes.Standby.pfnSetMode;
        if( nullptr == pfnSetMode )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hStandby = reinterpret_cast<zes_standby_object_t*>( hStandby )->handle;

        // forward to device-driver
        result = pfnSetMode( hStandby, mode );

        return result;
    }